

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

uchar * SHA1(uchar *d,size_t n,uchar *md)

{
  uchar *extraout_RAX;
  uint ii;
  SHA1_CTX ctx;
  uint local_74;
  uint32_t in_stack_ffffffffffffff94;
  SHA1_CTX *in_stack_ffffffffffffff98;
  SHA1_CTX *in_stack_ffffffffffffffa0;
  
  SHA1Init((SHA1_CTX *)&stack0xffffffffffffff90);
  for (local_74 = 0; local_74 < (uint)md; local_74 = local_74 + 1) {
    SHA1Update(in_stack_ffffffffffffffa0,(uchar *)in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff94);
  }
  SHA1Final((uchar *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return extraout_RAX;
}

Assistant:

void SHA1(
    char *hash_out,
    const char *str,
    uint32_t len)
{
    SHA1_CTX ctx;
    unsigned int ii;

    SHA1Init(&ctx);
    for (ii=0; ii<len; ii+=1)
        SHA1Update(&ctx, (const unsigned char*)str + ii, 1);
    SHA1Final((unsigned char *)hash_out, &ctx);
}